

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O0

FT_Error T1_Parse_Glyph(T1_Decoder_conflict decoder,FT_UInt glyph_index)

{
  FT_Face pFVar1;
  T1_Face face;
  FT_Error error;
  FT_Bool force_scaling;
  FT_Data glyph_data;
  FT_UInt glyph_index_local;
  T1_Decoder_conflict decoder_local;
  
  face._7_1_ = 0;
  glyph_data._12_4_ = glyph_index;
  face._0_4_ = T1_Parse_Glyph_And_Get_Char_String
                         (decoder,glyph_index,(FT_Data *)&error,(FT_Bool *)((long)&face + 7));
  if (((FT_Error)face == 0) &&
     (pFVar1 = (decoder->builder).face,
     pFVar1->internal->incremental_interface != (FT_Incremental_InterfaceRec *)0x0)) {
    (*pFVar1->internal->incremental_interface->funcs->free_glyph_data)
              (pFVar1->internal->incremental_interface->object,(FT_Data *)&error);
  }
  return (FT_Error)face;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  T1_Parse_Glyph( T1_Decoder  decoder,
                  FT_UInt     glyph_index )
  {
    FT_Data   glyph_data;
    FT_Bool   force_scaling = FALSE;
    FT_Error  error         = T1_Parse_Glyph_And_Get_Char_String(
                                decoder, glyph_index, &glyph_data,
                                &force_scaling );


#ifdef FT_CONFIG_OPTION_INCREMENTAL

    if ( !error )
    {
      T1_Face  face = (T1_Face)decoder->builder.face;


      if ( face->root.internal->incremental_interface )
        face->root.internal->incremental_interface->funcs->free_glyph_data(
          face->root.internal->incremental_interface->object,
          &glyph_data );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    return error;
  }